

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O3

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,VariableDeclarationNode *node)

{
  SymbolTable *this_00;
  pointer pcVar1;
  element_type *peVar2;
  optional<TypeName> *poVar3;
  tuple<Symbol_*,_std::default_delete<Symbol>_> tVar4;
  mapped_type *__rhs;
  long *plVar5;
  size_type *psVar6;
  pointer *__ptr;
  optional<std::reference_wrapper<Symbol>_> oVar7;
  string name;
  TypeChecker typeChecker;
  __uniq_ptr_impl<Symbol,_std::default_delete<Symbol>_> local_e8;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  TypeChecker local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (node->name_)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (node->name_)._M_string_length);
  this_00 = &this->symbols_;
  oVar7 = SymbolTable::lookup(this_00,&local_c0,1);
  if (((undefined1  [16])
       oVar7.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    std::operator+(&local_a0,"Redefinition of variable ",&local_c0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar6) {
      local_e0.field_2._M_allocated_capacity = *psVar6;
      local_e0.field_2._8_8_ = plVar5[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar6;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    reportError(&local_e0,(Node *)node);
  }
  peVar2 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,this);
  local_60.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001e9528;
  local_60.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  local_60.symbols_ = this_00;
  (*(((node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Node)._vptr_Node[2])();
  poVar3 = TypeChecker::getType(&local_60);
  if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged == true) {
    poVar3 = TypeChecker::getType(&local_60);
    if (((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
         super__Optional_payload_base<TypeName>._M_engaged != true) ||
       ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_payload._M_value != node->type_)) {
      poVar3 = TypeChecker::getType(&local_60);
      if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
          super__Optional_payload_base<TypeName>._M_engaged != false) {
        __rhs = std::
                unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at(&TypeNameStrings_abi_cxx11_,(key_type *)poVar3);
        std::operator+(&local_48,"Cannot assign value of type ",__rhs);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_80._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_80._M_dataplus._M_p == psVar6) {
          local_80.field_2._M_allocated_capacity = *psVar6;
          local_80.field_2._8_8_ = plVar5[3];
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = *psVar6;
        }
        local_80._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_a0,&local_80,&local_c0);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_e0._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_e0._M_dataplus._M_p == psVar6) {
          local_e0.field_2._M_allocated_capacity = *psVar6;
          local_e0.field_2._8_8_ = plVar5[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar6;
        }
        local_e0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        reportError(&local_e0,(Node *)node);
      }
      std::__throw_bad_optional_access();
    }
  }
  tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
  super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)operator_new(0x30);
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
   super__Head_base<0UL,_Symbol_*,_false>._M_head_impl = &PTR__VariableSymbol_001e9728;
  *(long **)((long)tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                   super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x18);
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             ((long)tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                    super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8),
             local_c0._M_dataplus._M_p,local_c0._M_dataplus._M_p + local_c0._M_string_length);
  *(TypeName *)
   ((long)tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x28) = node->type_;
  local_e8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
  super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
       (tuple<Symbol_*,_std::default_delete<Symbol>_>)
       (tuple<Symbol_*,_std::default_delete<Symbol>_>)
       tVar4.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
       super__Head_base<0UL,_Symbol_*,_false>._M_head_impl;
  SymbolTable::addSymbol
            (this_00,&local_c0,(unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_e8);
  if ((_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)
      local_e8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl != (Symbol *)0x0) {
    (**(code **)(*(long *)local_e8._M_t.
                          super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8))();
  }
  local_e8._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
  super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
       (tuple<Symbol_*,_std::default_delete<Symbol>_>)
       (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const VariableDeclarationNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name, 1);
  if(symbol)
    reportError("Redefinition of variable " + name + "!", node);
  
  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != node.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);

  auto variableSymbol = std::make_unique<VariableSymbol>(name, node.getType());
  symbols_.addSymbol(name, std::move(variableSymbol));
}